

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status __thiscall leveldb::BlockHandle::DecodeFrom(BlockHandle *this,Slice *input)

{
  long lVar1;
  bool bVar2;
  Slice *in_RSI;
  Slice *in_RDI;
  long in_FS_OFFSET;
  Slice *msg;
  Slice *value;
  Slice *input_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg = in_RDI;
  value = in_RSI;
  input_00 = in_RDI;
  bVar2 = GetVarint64(in_RDI,(uint64_t *)in_RSI);
  if ((bVar2) && (bVar2 = GetVarint64(input_00,(uint64_t *)value), bVar2)) {
    Status::OK();
  }
  else {
    Slice::Slice(in_RSI,(char *)msg);
    Slice::Slice(in_RDI);
    Status::Corruption(msg,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)msg;
}

Assistant:

Status BlockHandle::DecodeFrom(Slice* input) {
  if (GetVarint64(input, &offset_) && GetVarint64(input, &size_)) {
    return Status::OK();
  } else {
    return Status::Corruption("bad block handle");
  }
}